

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildProfiledReg1Unsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,int32 C1,ProfileId profileId)

{
  code *pcVar1;
  StackSym *pSVar2;
  ProfileId PVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ProfiledInstr *pPVar7;
  JitProfilingInstr *pJVar8;
  JITTimeProfileInfo *this_00;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_86;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_82;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7e;
  TypeId local_7c;
  ArrayCallSiteInfo *pAStack_78;
  TypeId arrayTypeId;
  ArrayCallSiteInfo *arrayInfo;
  IntConstOpnd *srcOpnd;
  StackSym *pSStack_60;
  int32 value;
  StackSym *dstSym;
  RegOpnd *dstOpnd;
  JitProfilingInstr *pJStack_48;
  RegSlot dstRegSlot;
  Instr *instr;
  Instr *instr_1;
  Opnd *src2Opnd;
  RegOpnd *src1Opnd;
  uint32 local_20;
  RegSlot RStack_1c;
  ProfileId profileId_local;
  int32 C1_local;
  RegSlot R0_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  src1Opnd._6_2_ = profileId;
  local_20 = C1;
  RStack_1c = R0;
  C1_local = offset;
  R0_local._2_2_ = newOpcode;
  _offset_local = this;
  if ((newOpcode != ProfiledNewScArray) && (newOpcode != ProfiledInitForInEnumerator)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xb94,
                       "(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator)"
                       ,
                       "newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator"
                      );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&R0_local + 2));
  if (R0_local._2_2_ == InitForInEnumerator) {
    src2Opnd = &BuildSrcOpnd(this,RStack_1c,TyVar)->super_Opnd;
    instr_1 = (Instr *)BuildForInEnumeratorOpnd(this,local_20,C1_local);
    instr = &IR::ProfiledInstr::New
                       (InitForInEnumerator,(Opnd *)0x0,src2Opnd,(Opnd *)instr_1,this->m_func)->
             super_Instr;
    uVar5 = (uint)src1Opnd._6_2_;
    pPVar7 = IR::Instr::AsProfiledInstr(instr);
    *(uint *)&pPVar7->u = uVar5;
    AddInstr(this,instr,C1_local);
  }
  else {
    dstOpnd._4_4_ = RStack_1c;
    dstSym = (StackSym *)BuildDstOpnd(this,RStack_1c,TyVar,false,false);
    pSStack_60 = *(StackSym **)&(dstSym->super_Sym).m_id;
    srcOpnd._4_4_ = local_20;
    arrayInfo = (ArrayCallSiteInfo *)
                IR::IntConstOpnd::New((long)(int)local_20,TyInt32,this->m_func,false);
    bVar4 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if (bVar4) {
      pJStack_48 = IR::JitProfilingInstr::New
                             (R0_local._2_2_,(Opnd *)dstSym,(Opnd *)arrayInfo,this->m_func);
      PVar3 = src1Opnd._6_2_;
      pJVar8 = IR::Instr::AsJitProfilingInstr(&pJStack_48->super_Instr);
      pJVar8->profileId = PVar3;
    }
    else {
      pJStack_48 = (JitProfilingInstr *)
                   IR::ProfiledInstr::New
                             (R0_local._2_2_,(Opnd *)dstSym,(Opnd *)arrayInfo,this->m_func);
      uVar5 = (uint)src1Opnd._6_2_;
      pPVar7 = IR::Instr::AsProfiledInstr((Instr *)pJStack_48);
      *(uint *)&pPVar7->u = uVar5;
    }
    AddInstr(this,&pJStack_48->super_Instr,C1_local);
    if ((*(uint *)&pSStack_60->field_0x18 & 1) != 0) {
      *(uint *)&pSStack_60->field_0x18 = *(uint *)&pSStack_60->field_0x18 & 0xfffffffb | 4;
      *(uint *)&pSStack_60->field_0x18 = *(uint *)&pSStack_60->field_0x18 & 0xfffffffd | 2;
    }
    pAStack_78 = (ArrayCallSiteInfo *)0x0;
    bVar4 = Func::HasArrayInfo(this->m_func);
    if (bVar4) {
      this_00 = Func::GetReadOnlyProfileInfo(this->m_func);
      pAStack_78 = JITTimeProfileInfo::GetArrayCallSiteInfo(this_00,src1Opnd._6_2_);
    }
    local_7c = TypeIds_Array;
    if (((pAStack_78 != (ArrayCallSiteInfo *)0x0) &&
        (bVar4 = Func::IsJitInDebugMode(this->m_func), !bVar4)) &&
       (bVar4 = Js::JavascriptArray::HasInlineHeadSegment(srcOpnd._4_4_), bVar4)) {
      bVar4 = Js::ArrayCallSiteInfo::IsNativeIntArray(pAStack_78);
      if (bVar4) {
        local_7c = TypeIds_NativeIntArray;
      }
      else {
        bVar4 = Js::ArrayCallSiteInfo::IsNativeFloatArray(pAStack_78);
        if (bVar4) {
          local_7c = TypeIds_ArrayLast;
        }
      }
    }
    pSVar2 = dstSym;
    local_82.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_80.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_82.field_0,true);
    local_7e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)&local_80.field_0,local_7c);
    IR::Opnd::SetValueType((Opnd *)pSVar2,(ValueType)local_7e.field_0);
    local_84.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType((Opnd *)dstSym);
    bVar4 = ValueType::HasVarElements((ValueType *)&local_84.field_0);
    pSVar2 = dstSym;
    if (bVar4) {
      IR::Opnd::SetValueTypeFixed((Opnd *)dstSym);
    }
    else {
      local_88.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType((Opnd *)dstSym);
      local_86.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToLikely((ValueType *)&local_88.field_0);
      IR::Opnd::SetValueType((Opnd *)pSVar2,(ValueType)local_86.field_0);
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledReg1Unsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, int32 C1, Js::ProfileId profileId)
{
    Assert(newOpcode == Js::OpCode::ProfiledNewScArray || newOpcode == Js::OpCode::ProfiledInitForInEnumerator);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    if (newOpcode == Js::OpCode::InitForInEnumerator)
    {
        IR::RegOpnd * src1Opnd = this->BuildSrcOpnd(R0);
        IR::Opnd * src2Opnd = this->BuildForInEnumeratorOpnd(C1, offset);
        IR::Instr *instr = IR::ProfiledInstr::New(Js::OpCode::InitForInEnumerator, nullptr, src1Opnd, src2Opnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
        this->AddInstr(instr, offset);
        return;
    }

    IR::Instr *instr;
    Js::RegSlot     dstRegSlot = R0;
    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(dstRegSlot);

    StackSym *      dstSym = dstOpnd->m_sym;
    int32           value = C1;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    if (m_func->DoSimpleJitDynamicProfile())
    {
        instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else
    {
        instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, srcOpnd, m_func);
        instr->AsProfiledInstr()->u.profileId = profileId;
    }

    this->AddInstr(instr, offset);

    if (dstSym->m_isSingleDef)
    {
        dstSym->m_isSafeThis = true;
        dstSym->m_isNotNumber = true;
    }

    // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    if (m_func->HasArrayInfo())
    {
        arrayInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
    }
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (arrayInfo && !m_func->IsJitInDebugMode() && Js::JavascriptArray::HasInlineHeadSegment(value))
    {
        if (arrayInfo->IsNativeIntArray())
        {
            arrayTypeId = Js::TypeIds_NativeIntArray;
        }
        else if (arrayInfo->IsNativeFloatArray())
        {
            arrayTypeId = Js::TypeIds_NativeFloatArray;
        }
    }
    dstOpnd->SetValueType(ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    if (dstOpnd->GetValueType().HasVarElements())
    {
        dstOpnd->SetValueTypeFixed();
    }
    else
    {
        dstOpnd->SetValueType(dstOpnd->GetValueType().ToLikely());
    }
}